

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::toString(string *__return_storage_ptr__,wstring *value)

{
  size_t i;
  ulong uVar1;
  undefined1 local_50 [8];
  string s;
  
  local_50 = (undefined1  [8])&s._M_string_length;
  s._M_dataplus._M_p = (pointer)0x0;
  s._M_string_length._0_1_ = 0;
  std::__cxx11::string::reserve((ulong)local_50);
  for (uVar1 = 0; uVar1 < value->_M_string_length; uVar1 = uVar1 + 1) {
    std::__cxx11::string::push_back((char)local_50);
  }
  toString(__return_storage_ptr__,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( std::wstring const& value ) {

    std::string s;
    s.reserve( value.size() );
    for(size_t i = 0; i < value.size(); ++i )
        s += value[i] <= 0xff ? static_cast<char>( value[i] ) : '?';
    return Catch::toString( s );
}